

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CacheFunction.hpp
# Opt level: O2

HashKey __thiscall
CacheFunction<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/libKriging[P]libKriging/tests/CacheFunctionTest.cpp:104:12),_std::function<double_()>,_double>
::hash_args(CacheFunction<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_libKriging[P]libKriging_tests_CacheFunctionTest_cpp:104:12),_std::function<double_()>,_double>
            *this)

{
  size_t sVar1;
  
  sVar1 = details::tupleHash<std::tuple<double_const&>const&>(&this->m_context);
  return sVar1 ^ (sVar1 >> 2) + sVar1 * 0x40 + 0x9e3779ba;
}

Assistant:

auto hash_args(Args... args) const -> HashKey {
    const auto args_hash = details::tupleHash(std::forward_as_tuple(args...));
    if constexpr (std::tuple_size<decltype(m_context)>{} == 0) {
      return args_hash;
    } else {
      const auto context_hash = details::tupleHash(m_context);
      return details::composeHash(context_hash, args_hash);
    }
  }